

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiasLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  BiasLayerParams *this_00;
  WeightParams *pWVar5;
  string *psVar6;
  uint64_t uVar7;
  uint64_t outChannels;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  byte local_1da;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  byte local_18d;
  int local_18c;
  uint64_t uStack_188;
  int i;
  size_t total_shape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string err_1;
  undefined1 local_c0 [8];
  string err;
  WeightParamType paramType;
  BiasLayerParams *params;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Bias",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Bias",(allocator<char> *)((long)&params + 7));
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,3,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      this_00 = Specification::NeuralNetworkLayer::bias(local_20);
      pWVar5 = Specification::BiasLayerParams::bias(this_00);
      err.field_2._12_4_ = valueType(pWVar5);
      if (err.field_2._12_4_ == UNSPECIFIED) {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        __return_storage_ptr___00 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&err_1.field_2 + 8);
        std::operator+(__return_storage_ptr___00,"Bias product layer \'",psVar6);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,__return_storage_ptr___00,
                       "\' has both full precision and half precision weights and/or bias fields populated"
                      );
        std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c0);
        local_38 = 1;
        std::__cxx11::string::~string((string *)local_c0);
      }
      else {
        iVar3 = Specification::BiasLayerParams::shape_size(this_00);
        if ((iVar3 == 1) ||
           (iVar3 = Specification::BiasLayerParams::shape_size(this_00), iVar3 == 3)) {
          uStack_188 = 1;
          for (local_18c = 0; iVar3 = local_18c,
              iVar4 = Specification::BiasLayerParams::shape_size(this_00), iVar3 < iVar4;
              local_18c = local_18c + 1) {
            uVar7 = Specification::BiasLayerParams::shape(this_00,local_18c);
            uStack_188 = uVar7 * uStack_188;
          }
          iVar3 = Specification::BiasLayerParams::shape_size(this_00);
          if ((iVar3 == 3) && (uVar7 = Specification::BiasLayerParams::shape(this_00,0), 1 < uVar7))
          {
            local_18d = 0;
            pWVar5 = Specification::BiasLayerParams::bias(this_00);
            uVar7 = uStack_188;
            outChannels = Specification::BiasLayerParams::shape(this_00,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"Bias",&local_1b1);
            psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,"bias",&local_1d9);
            validateGeneralWeightParams
                      (__return_storage_ptr__,pWVar5,uVar7,outChannels,&local_1b0,psVar6,&local_1d8)
            ;
            std::__cxx11::string::~string((string *)&local_1d8);
            std::allocator<char>::~allocator(&local_1d9);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::allocator<char>::~allocator(&local_1b1);
            bVar2 = Result::good(__return_storage_ptr__);
            if (!bVar2) {
              local_18d = 1;
            }
            local_38 = (uint)!bVar2;
            if ((local_18d & 1) == 0) {
              Result::~Result(__return_storage_ptr__);
            }
          }
          else {
            local_1da = 0;
            pWVar5 = Specification::BiasLayerParams::bias(this_00);
            uVar7 = uStack_188;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_200,"Bias",&local_201);
            psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,"bias",&local_229);
            validateGeneralWeightParams
                      (__return_storage_ptr__,pWVar5,uVar7,1,&local_200,psVar6,&local_228);
            std::__cxx11::string::~string((string *)&local_228);
            std::allocator<char>::~allocator(&local_229);
            std::__cxx11::string::~string((string *)&local_200);
            std::allocator<char>::~allocator(&local_201);
            bVar2 = Result::good(__return_storage_ptr__);
            if (!bVar2) {
              local_1da = 1;
            }
            local_38 = (uint)!bVar2;
            if ((local_1da & 1) == 0) {
              Result::~Result(__return_storage_ptr__);
            }
          }
          if (local_38 == 0) {
            Result::Result(__return_storage_ptr__);
          }
        }
        else {
          psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+(&local_160,"Bias layer \'",psVar6);
          std::operator+(&local_140,&local_160,"\' cannot be ");
          iVar3 = Specification::BiasLayerParams::shape_size(this_00);
          std::__cxx11::to_string((string *)&total_shape,iVar3);
          std::operator+(&local_120,&local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &total_shape);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,&local_120," dimensional. Must be 1D or 3D.");
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&total_shape);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_100);
          local_38 = 1;
          std::__cxx11::string::~string((string *)local_100);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiasLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Bias", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Bias", 3, -1, blobNameToRank));
    }

    const auto& params = layer.bias();
    WeightParamType paramType = valueType(params.bias());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Bias product layer '" + layer.name() + "' has both full precision and half precision weights and/or bias fields populated";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (params.shape_size() != 1 && params.shape_size() != 3) {
        std::string err = "Bias layer '" + layer.name() + "' cannot be " + std::to_string(params.shape_size()) + " dimensional. Must be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // shape can be ``[1]``, ``[C]``, ``[1, H, W]`` or ``[C, H, W]``
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.bias(), total_shape, params.shape(0), "Bias", layer.name(), "bias"));
    } else {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.bias(), total_shape, 1, "Bias", layer.name(), "bias"));
    }

    return Result();
}